

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong in_RCX;
  int64_t in_RDX;
  char tmp [50];
  char *t;
  int i;
  int digit;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  archive_string *in_stack_ffffffffffffffc0;
  char local_38 [8];
  char *local_30;
  int local_28;
  int local_24;
  ulong local_20;
  
  local_38[1] = 0;
  local_30 = local_38 + 1;
  local_24 = 0;
  local_20 = in_RCX;
  for (local_28 = 10; 0 < local_28 && local_24 == 0; local_28 = local_28 + -1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_20;
    local_24 = SUB164(auVar1 % ZEXT816(10),0);
    local_20 = local_20 / 10;
  }
  if (0 < local_28) {
    for (; 0 < local_28; local_28 = local_28 + -1) {
      local_30[-1] = "0123456789"[local_24];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_20;
      local_24 = SUB164(auVar2 % ZEXT816(10),0);
      local_20 = local_20 / 10;
      local_30 = local_30 + -1;
    }
    local_30[-1] = '.';
    local_30 = local_30 + -1;
  }
  local_30 = format_int(local_30,in_RDX);
  add_pax_attr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}